

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O2

int64_t os_get_nanosecs(void)

{
  timespec ts;
  
  clock_gettime(4,(timespec *)&ts);
  return ts.tv_sec * 1000000000 + ts.tv_nsec;
}

Assistant:

int64_t os_get_nanosecs(void) {
#if defined(_MSC_VER) || defined(__MINGW64__) || defined(__MINGW32__)
    LARGE_INTEGER counter;
    static LARGE_INTEGER frequency = {0};
    if (frequency.QuadPart == 0) {
        QueryPerformanceFrequency(&frequency);
    }
    QueryPerformanceCounter(&counter);
    return CAST(int64_t, (counter.QuadPart * 1000000000) / frequency.QuadPart);
#elif defined(__linux__) && defined(__STRICT_ANSI__)
    return CAST(int64_t, clock()) * 1000000000 / CLOCKS_PER_SEC;
#elif defined(__linux__) || defined(__FreeBSD__) || defined(__OpenBSD__) ||    \
    defined(__NetBSD__) || defined(__DragonFly__)
    struct timespec ts;
    clock_gettime(CLOCK_MONOTONIC_RAW, &ts);
    return (int64_t)ts.tv_sec * 1000 * 1000 * 1000 + ts.tv_nsec;
#elif __APPLE__
    return (int64_t)clock_gettime_nsec_np(CLOCK_MONOTONIC_RAW);
#elif __EMSCRIPTEN__
    return emscripten_performance_now() * 1000000.0;
#else
#error Unsupported platform!
#endif
}